

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigObj.c
# Opt level: O3

Aig_Obj_t * Aig_ObjCreate(Aig_Man_t *p,Aig_Obj_t *pGhost)

{
  int iVar1;
  uint uVar2;
  Vec_Ptr_t *pVVar3;
  Vec_Int_t *pVVar4;
  Aig_Obj_t *pAVar5;
  Aig_Obj_t *pAVar6;
  uint uVar7;
  uint uVar8;
  Aig_Obj_t *pObj;
  void **ppvVar9;
  int *__ptr;
  uint uVar10;
  float fVar11;
  float fVar12;
  
  if (((ulong)pGhost & 1) != 0) {
    __assert_fail("!Aig_IsComplement(pGhost)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigObj.c"
                  ,0x5c,"Aig_Obj_t *Aig_ObjCreate(Aig_Man_t *, Aig_Obj_t *)");
  }
  if ((*(uint *)&pGhost->field_0x18 & 7) - 7 < 0xfffffffe) {
    __assert_fail("Aig_ObjIsHash(pGhost)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigObj.c"
                  ,0x5d,"Aig_Obj_t *Aig_ObjCreate(Aig_Man_t *, Aig_Obj_t *)");
  }
  pObj = (Aig_Obj_t *)Aig_MmFixedEntryFetch(p->pMemObjs);
  (pObj->field_0).pNext = (Aig_Obj_t *)0x0;
  pObj->pFanin0 = (Aig_Obj_t *)0x0;
  pObj->pFanin1 = (Aig_Obj_t *)0x0;
  *(undefined8 *)&pObj->field_0x18 = 0;
  pObj->TravId = 0;
  pObj->Id = 0;
  (pObj->field_5).pData = (void *)0x0;
  pVVar3 = p->vObjs;
  uVar8 = pVVar3->nSize;
  pObj->Id = uVar8;
  if (uVar8 == pVVar3->nCap) {
    if ((int)uVar8 < 0x10) {
      if (pVVar3->pArray == (void **)0x0) {
        ppvVar9 = (void **)malloc(0x80);
      }
      else {
        ppvVar9 = (void **)realloc(pVVar3->pArray,0x80);
      }
      pVVar3->pArray = ppvVar9;
      pVVar3->nCap = 0x10;
    }
    else {
      if (pVVar3->pArray == (void **)0x0) {
        ppvVar9 = (void **)malloc((ulong)uVar8 << 4);
      }
      else {
        ppvVar9 = (void **)realloc(pVVar3->pArray,(ulong)uVar8 << 4);
      }
      pVVar3->pArray = ppvVar9;
      pVVar3->nCap = uVar8 * 2;
    }
  }
  else {
    ppvVar9 = pVVar3->pArray;
  }
  iVar1 = pVVar3->nSize;
  pVVar3->nSize = iVar1 + 1;
  ppvVar9[iVar1] = pObj;
  *(ulong *)&pObj->field_0x18 =
       *(ulong *)&pObj->field_0x18 & 0xfffffffffffffff8 |
       (ulong)((uint)*(undefined8 *)&pGhost->field_0x18 & 7);
  Aig_ObjConnect(p,pObj,pGhost->pFanin0,pGhost->pFanin1);
  p->nObjs[*(uint *)&pObj->field_0x18 & 7] = p->nObjs[*(uint *)&pObj->field_0x18 & 7] + 1;
  if ((pObj->field_5).pData != (void *)0x0) {
    __assert_fail("pObj->pData == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigObj.c"
                  ,0x66,"Aig_Obj_t *Aig_ObjCreate(Aig_Man_t *, Aig_Obj_t *)");
  }
  pVVar4 = p->vProbs;
  if (pVVar4 == (Vec_Int_t *)0x0) {
    return pObj;
  }
  pAVar5 = pObj->pFanin0;
  if (pAVar5 == (Aig_Obj_t *)0x0) {
LAB_006c2b32:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  iVar1 = *(int *)(((ulong)pAVar5 & 0xfffffffffffffffe) + 0x24);
  if ((((long)iVar1 < 0) || (uVar8 = pVVar4->nSize, (int)uVar8 <= iVar1)) ||
     (pAVar6 = pObj->pFanin1, pAVar6 == (Aig_Obj_t *)0x0)) goto LAB_006c2b32;
  uVar2 = *(uint *)(((ulong)pAVar6 & 0xfffffffffffffffe) + 0x24);
  if (((long)(int)uVar2 < 0) || (uVar8 <= uVar2)) goto LAB_006c2b32;
  __ptr = pVVar4->pArray;
  fVar12 = (float)__ptr[iVar1];
  if (((ulong)pAVar5 & 1) != 0) {
    fVar12 = 1.0 - fVar12;
  }
  fVar11 = (float)__ptr[(int)uVar2];
  if (((ulong)pAVar6 & 1) != 0) {
    fVar11 = 1.0 - fVar11;
  }
  uVar2 = pObj->Id;
  if ((int)uVar2 < (int)uVar8) goto LAB_006c2b04;
  uVar10 = uVar2 + 1;
  uVar7 = pVVar4->nCap * 2;
  if ((int)uVar2 < (int)uVar7) {
    if (pVVar4->nCap <= (int)uVar2) {
      __ptr = (int *)realloc(__ptr,(ulong)uVar7 << 2);
      pVVar4->pArray = __ptr;
      goto joined_r0x006c2ab7;
    }
  }
  else {
    __ptr = (int *)realloc(__ptr,(ulong)uVar10 << 2);
    pVVar4->pArray = __ptr;
    uVar7 = uVar10;
joined_r0x006c2ab7:
    if (__ptr == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    pVVar4->nCap = uVar7;
    uVar8 = pVVar4->nSize;
  }
  if ((int)uVar8 <= (int)uVar2) {
    memset(__ptr + (int)uVar8,0,(ulong)(uVar2 - uVar8) * 4 + 4);
  }
  pVVar4->nSize = uVar10;
  uVar8 = uVar10;
LAB_006c2b04:
  if ((-1 < (int)uVar2) && ((int)uVar2 < (int)uVar8)) {
    __ptr[uVar2] = (int)(fVar12 * fVar11);
    return pObj;
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
}

Assistant:

Aig_Obj_t * Aig_ObjCreate( Aig_Man_t * p, Aig_Obj_t * pGhost )
{
    Aig_Obj_t * pObj;
    assert( !Aig_IsComplement(pGhost) );
    assert( Aig_ObjIsHash(pGhost) );
//    assert( pGhost == &p->Ghost );
    // get memory for the new object
    pObj = Aig_ManFetchMemory( p );
    pObj->Type = pGhost->Type;
    // add connections
    Aig_ObjConnect( p, pObj, pGhost->pFanin0, pGhost->pFanin1 );
    // update node counters of the manager
    p->nObjs[Aig_ObjType(pObj)]++;
    assert( pObj->pData == NULL );
    // create the power counter
    if ( p->vProbs )
    {
        float Prob0 = Abc_Int2Float( Vec_IntEntry( p->vProbs, Aig_ObjFaninId0(pObj) ) );
        float Prob1 = Abc_Int2Float( Vec_IntEntry( p->vProbs, Aig_ObjFaninId1(pObj) ) );
        Prob0 = Aig_ObjFaninC0(pObj)? 1.0 - Prob0 : Prob0;
        Prob1 = Aig_ObjFaninC1(pObj)? 1.0 - Prob1 : Prob1;
        Vec_IntSetEntry( p->vProbs, pObj->Id, Abc_Float2Int(Prob0 * Prob1) );
    }
    return pObj;
}